

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountFailureRepr.cpp
# Opt level: O3

string * __thiscall
CountFailureRepr::asString_abi_cxx11_(string *__return_storage_ptr__,CountFailureRepr *this)

{
  bool bVar1;
  char cVar2;
  size_t __val;
  size_t sVar3;
  string *__str;
  char cVar4;
  
  __val = oout::CountFailure::count
                    ((this->count).
                     super___shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
  cVar4 = '\x01';
  if (9 < __val) {
    sVar3 = __val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (sVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001533fd;
      }
      if (sVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001533fd;
      }
      if (sVar3 < 10000) goto LAB_001533fd;
      bVar1 = 99999 < sVar3;
      sVar3 = sVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001533fd:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,__val);
  return __return_storage_ptr__;
}

Assistant:

string CountFailureRepr::asString() const
{
	return to_string(count->count());
}